

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::GenerateByteSize
          (RepeatedPrimitive *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  LogMessage *pLVar3;
  Sub *local_2c0;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  undefined1 local_269;
  anon_class_16_2_fd512ddd_for_cb local_268;
  allocator<char> local_251;
  string local_250;
  anon_class_16_2_fd512ddd_for_cb local_230 [2];
  allocator<char> local_209;
  string local_208;
  Sub *local_1e8;
  Sub local_1e0;
  Sub local_128;
  iterator local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_60;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_31;
  LogMessage local_30;
  Voidify local_19;
  undefined1 local_18 [8];
  Printer *p_local;
  RepeatedPrimitive *this_local;
  
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  bVar2 = HasCachedSize(this);
  auVar1 = local_18;
  if (bVar2) {
    bVar2 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
    local_31 = 0;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/primitive_field.cc"
                 ,599,"field_->is_packed()");
      local_31 = 1;
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
    }
    auVar1 = local_18;
    if ((local_31 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,
               "\n          total_size +=\n              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(\n                  this_._internal_$name$(), $kTagBytes$,\n                  this_.$_field_cached_byte_size_$);\n        "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit((Printer *)auVar1,local_48._M_len,local_48._M_str);
  }
  else {
    local_269 = 1;
    local_1e8 = &local_1e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"data_size",&local_209);
    local_230[0].p = (Printer **)local_18;
    local_230[0].this = this;
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateByteSize(google::protobuf::io::Printer*)const::__0>
              (&local_1e0,&local_208,local_230);
    local_1e8 = &local_128;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"tag_size",&local_251);
    local_268.p = (Printer **)local_18;
    local_268.this = this;
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateByteSize(google::protobuf::io::Printer*)const::__1>
              (&local_128,&local_250,&local_268);
    local_269 = 0;
    local_70 = &local_1e0;
    local_68 = 2;
    v._M_len = 2;
    v._M_array = local_70;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_60._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_280,
               "\n        ::size_t data_size = $data_size$;\n        ::size_t tag_size = $tag_size$;\n        total_size += tag_size + data_size;\n      "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit
              ((Printer *)auVar1,local_60._M_allocated_capacity,local_60._8_8_,local_280._M_len,
               local_280._M_str);
    local_2c0 = (Sub *)&local_70;
    do {
      local_2c0 = local_2c0 + -1;
      protobuf::io::Printer::Sub::~Sub(local_2c0);
    } while (local_2c0 != &local_1e0);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
  }
  return;
}

Assistant:

void RepeatedPrimitive::GenerateByteSize(io::Printer* p) const {
  if (HasCachedSize()) {
    ABSL_CHECK(field_->is_packed());
    p->Emit(
        R"cc(
          total_size +=
              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(
                  this_._internal_$name$(), $kTagBytes$,
                  this_.$_field_cached_byte_size_$);
        )cc");
    return;
  }
  p->Emit(
      {
          {"data_size",
           [&] {
             auto fixed_size = FixedSize(field_->type());
             if (fixed_size.has_value()) {
               p->Emit({{"kFixed", *fixed_size}}, R"cc(
                 ::size_t{$kFixed$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
          {"tag_size",
           [&] {
             if (field_->is_packed()) {
               p->Emit(R"cc(
                 data_size == 0
                     ? 0
                     : $kTagBytes$ + ::_pbi::WireFormatLite::Int32Size(
                                         static_cast<::int32_t>(data_size));
               )cc");
             } else {
               p->Emit(R"cc(
                 ::size_t{$kTagBytes$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             }
           }},
      },
      R"cc(
        ::size_t data_size = $data_size$;
        ::size_t tag_size = $tag_size$;
        total_size += tag_size + data_size;
      )cc");
}